

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O1

uchar * __thiscall ON_WindowsBitmap::Bits(ON_WindowsBitmap *this,int scan_index)

{
  unsigned_short uVar1;
  ON_WindowsBITMAPINFO *pOVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  uchar *puVar5;
  uint uVar6;
  ON_WindowsRGBQUAD *pOVar7;
  
  iVar3 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1b])()
  ;
  pOVar2 = this->m_bmi;
  if (pOVar2 == (ON_WindowsBITMAPINFO *)0x0) {
    pOVar7 = (ON_WindowsRGBQUAD *)0x0;
  }
  else {
    uVar6 = (pOVar2->bmiHeader).biClrUsed;
    if (uVar6 == 0) {
      uVar1 = (pOVar2->bmiHeader).biBitCount;
      if (uVar1 == 1) {
        uVar6 = 2;
      }
      else if (uVar1 == 8) {
        uVar6 = 0x100;
      }
      else if (uVar1 == 4) {
        uVar6 = 0x10;
      }
      else {
        uVar6 = 0;
      }
    }
    pOVar7 = pOVar2->bmiColors + (int)uVar6;
  }
  puVar5 = (uchar *)0x0;
  if (((-1 < scan_index) && (CONCAT44(extraout_var,iVar3) != 0)) &&
     (pOVar7 != (ON_WindowsRGBQUAD *)0x0)) {
    iVar4 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x19])
                      (this);
    if (scan_index < iVar4) {
      puVar5 = &pOVar7->rgbBlue + CONCAT44(extraout_var,iVar3) * (ulong)(uint)scan_index;
    }
    else {
      puVar5 = (uchar *)0x0;
    }
  }
  return puVar5;
}

Assistant:

const unsigned char* ON_WindowsBitmap::Bits(int scan_index) const
{
  const size_t sizeof_scan = SizeofScan();
  const unsigned char* bits = m_bmi ? (const unsigned char*)&m_bmi->bmiColors[PaletteColorCount()] : 0;
  if ( bits && sizeof_scan && scan_index >= 0 && scan_index < Height() ) {
    bits += (sizeof_scan*scan_index);
  }
  else {
    bits = 0;
  }
  return bits;
}